

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_IsArray(JSContext *ctx,JSValue val)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = 0;
  if ((int)val.tag == -1) {
    sVar1 = *(short *)((long)val.u.ptr + 6);
    if (sVar1 == 0x29) {
      iVar3 = js_proxy_isArray(ctx,val);
      return iVar3;
    }
    uVar2 = (uint)(sVar1 == 2);
  }
  return uVar2;
}

Assistant:

int JS_IsArray(JSContext *ctx, JSValueConst val)
{
    JSObject *p;
    if (JS_VALUE_GET_TAG(val) == JS_TAG_OBJECT) {
        p = JS_VALUE_GET_OBJ(val);
        if (unlikely(p->class_id == JS_CLASS_PROXY))
            return js_proxy_isArray(ctx, val);
        else
            return p->class_id == JS_CLASS_ARRAY;
    } else {
        return FALSE;
    }
}